

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::ByteBuffer*>
          (BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,ByteBuffer **key)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  hash_t hVar4;
  uint uVar5;
  hash_t extraout_EDX;
  hash_t extraout_EDX_00;
  DictionaryStats *this_00;
  int iVar6;
  DefaultHashedEntry<Js::ByteBuffer*,Js::IndexEntry,JsUtil::(anonymous_namespace)::KeyValueEntry>
  *pDVar7;
  
  lVar1 = *(long *)this;
  if (lVar1 == 0) {
    uVar5 = 0;
  }
  else {
    hVar4 = GetHashCodeWithKey<Js::ByteBuffer*>(key);
    uVar5 = BaseDictionary<Js::ByteBuffer_*,_Js::IndexEntry,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<Js::ByteBuffer_*,_Js::IndexEntry,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,hVar4);
    lVar2 = *(long *)(this + 8);
    pDVar7 = (DefaultHashedEntry<Js::ByteBuffer*,Js::IndexEntry,JsUtil::(anonymous_namespace)::KeyValueEntry>
              *)(lVar1 + (ulong)uVar5 * 4);
    uVar5 = 0;
    hVar4 = extraout_EDX;
    while( true ) {
      iVar6 = *(int *)pDVar7;
      if ((long)iVar6 < 0) break;
      pDVar7 = (DefaultHashedEntry<Js::ByteBuffer*,Js::IndexEntry,JsUtil::(anonymous_namespace)::KeyValueEntry>
                *)((long)iVar6 * 0x20 + lVar2);
      bVar3 = DefaultHashedEntry<Js::ByteBuffer*,Js::IndexEntry,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::KeyEquals<DefaultComparer<Js::ByteBuffer*>,Js::ByteBuffer*>(pDVar7,key,hVar4);
      if (bVar3) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_007b45ad;
      }
      uVar5 = uVar5 + 1;
      pDVar7 = pDVar7 + 0x10;
      hVar4 = extraout_EDX_00;
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar6 = -1;
LAB_007b45ad:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar5);
  }
  return iVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }